

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

void __thiscall
helics::apps::SineGenerator::set(SineGenerator *this,string_view parameter,double val)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_09;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  bool bVar2;
  char *in_RDX;
  char *in_RSI;
  SignalGenerator *in_RDI;
  _func_int **in_XMM0_Qa;
  char *in_stack_fffffffffffffe78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *pcVar3;
  size_t in_stack_fffffffffffffe98;
  char *pcVar4;
  char *in_stack_fffffffffffffea0;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  __x._M_str = in_stack_fffffffffffffea0;
  __x._M_len = in_stack_fffffffffffffe98;
  __y._M_str = in_stack_fffffffffffffe90;
  __y._M_len = in_stack_fffffffffffffe88;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    __x_00._M_str = in_stack_fffffffffffffea0;
    __x_00._M_len = in_stack_fffffffffffffe98;
    __y_00._M_str = in_stack_fffffffffffffe90;
    __y_00._M_len = in_stack_fffffffffffffe88;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      __x_01._M_str = in_stack_fffffffffffffea0;
      __x_01._M_len = in_stack_fffffffffffffe98;
      __y_01._M_str = in_stack_fffffffffffffe90;
      __y_01._M_len = in_stack_fffffffffffffe88;
      bVar2 = std::operator==(__x_01,__y_01);
      if (!bVar2) {
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        __x_02._M_str = in_stack_fffffffffffffea0;
        __x_02._M_len = in_stack_fffffffffffffe98;
        __y_02._M_str = in_stack_fffffffffffffe90;
        __y_02._M_len = in_stack_fffffffffffffe88;
        bVar2 = std::operator==(__x_02,__y_02);
        if (bVar2) {
          in_RDI[1].lastTime.internalTimeCode = (baseType)(1.0 / (double)in_XMM0_Qa);
          return;
        }
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        __x_03._M_str = in_stack_fffffffffffffea0;
        __x_03._M_len = in_stack_fffffffffffffe98;
        __y_03._M_str = in_stack_fffffffffffffe90;
        __y_03._M_len = in_stack_fffffffffffffe88;
        bVar2 = std::operator==(__x_03,__y_03);
        if (bVar2) {
          *(_func_int ***)&in_RDI[1].mName.field_2 = in_XMM0_Qa;
          return;
        }
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        __x_04._M_str = in_stack_fffffffffffffea0;
        __x_04._M_len = in_stack_fffffffffffffe98;
        __y_04._M_str = in_stack_fffffffffffffe90;
        __y_04._M_len = in_stack_fffffffffffffe88;
        bVar2 = std::operator==(__x_04,__y_04);
        if (bVar2) {
          in_RDI[1].mName._M_string_length = (size_type)in_XMM0_Qa;
          return;
        }
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        __x_05._M_str = in_stack_fffffffffffffea0;
        __x_05._M_len = in_stack_fffffffffffffe98;
        __y_05._M_str = in_stack_fffffffffffffe90;
        __y_05._M_len = in_stack_fffffffffffffe88;
        bVar2 = std::operator==(__x_05,__y_05);
        if (!bVar2) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          __x_06._M_str = in_stack_fffffffffffffea0;
          __x_06._M_len = in_stack_fffffffffffffe98;
          __y_06._M_str = in_stack_fffffffffffffe90;
          __y_06._M_len = in_stack_fffffffffffffe88;
          bVar2 = std::operator==(__x_06,__y_06);
          if (!bVar2) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            __x_07._M_str = in_stack_fffffffffffffea0;
            __x_07._M_len = in_stack_fffffffffffffe98;
            __y_07._M_str = in_stack_fffffffffffffe90;
            __y_07._M_len = in_stack_fffffffffffffe88;
            bVar2 = std::operator==(__x_07,__y_07);
            if (!bVar2) {
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              __x_08._M_str = in_stack_fffffffffffffea0;
              __x_08._M_len = in_stack_fffffffffffffe98;
              __y_08._M_str = in_stack_fffffffffffffe90;
              __y_08._M_len = in_stack_fffffffffffffe88;
              bVar2 = std::operator==(__x_08,__y_08);
              if (bVar2) {
                in_RDI[1]._vptr_SignalGenerator = in_XMM0_Qa;
                return;
              }
              pcVar3 = in_RSI;
              pcVar4 = in_RDX;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              __x_09._M_str = in_stack_fffffffffffffea0;
              __x_09._M_len = (size_t)pcVar4;
              __y_09._M_str = pcVar3;
              __y_09._M_len = in_stack_fffffffffffffe88;
              bVar2 = std::operator==(__x_09,__y_09);
              if (!bVar2) {
                sVar1._M_str = in_RDX;
                sVar1._M_len = (size_t)in_RSI;
                SignalGenerator::set(in_RDI,sVar1,(double)in_XMM0_Qa);
                return;
              }
              in_RDI[1].keyTime.internalTimeCode = (baseType)in_XMM0_Qa;
              return;
            }
          }
        }
        in_RDI[1].mName._M_dataplus._M_p = (pointer)in_XMM0_Qa;
        return;
      }
    }
  }
  in_RDI[1].lastTime.internalTimeCode = (baseType)in_XMM0_Qa;
  return;
}

Assistant:

void SineGenerator::set(std::string_view parameter, double val)
    {
        if ((parameter == "frequency") || (parameter == "freq") || (parameter == "f")) {
            frequency = val;
        } else if (parameter == "period") {
            frequency = 1.0 / val;
        } else if (parameter == "dfdt") {
            dfdt = val;
        } else if (parameter == "dadt") {
            dAdt = val;
        } else if ((parameter == "amplitude") || (parameter == "amp") || (parameter == "a")) {
            amplitude = val;
        } else if (parameter == "level") {
            level = val;
        } else if (parameter == "offset") {
            offset = val;
        } else {
            SignalGenerator::set(parameter, val);
        }
    }